

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O0

void __thiscall pool_tests::memusage_test::test_method(memusage_test *this)

{
  bool bVar1;
  size_t line_num;
  long in_FS_OFFSET;
  unsigned_long max_nodes_per_chunk;
  size_t i;
  unsigned_long min_num_allocated_chunks;
  Map resource_map;
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  std_map;
  ResourceType resource;
  PoolResource<48UL,_8UL> *in_stack_fffffffffffffc48;
  lazy_ostream *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  size_type in_stack_fffffffffffffc60;
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
  *in_stack_fffffffffffffc68;
  const_string *in_stack_fffffffffffffc70;
  const_string *msg;
  PoolResource<48UL,_8UL> *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  lazy_ostream *in_stack_fffffffffffffc88;
  PoolResource<48UL,_8UL> *in_stack_fffffffffffffce0;
  PoolResource<48UL,_8UL> *resource_00;
  const_string local_300 [2];
  lazy_ostream local_2e0 [2];
  size_t local_2c0;
  const_string local_258 [2];
  lazy_ostream local_238;
  assertion_result local_1e8 [2];
  PoolResource<48UL,_8UL> *local_1b0;
  PoolResource<48UL,_8UL> *local_1a8;
  const_string local_1a0 [2];
  lazy_ostream local_180 [2];
  size_t local_160;
  size_t local_158;
  assertion_result local_130 [5];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_78 = 0;
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::unordered_map((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                   *)in_stack_fffffffffffffc48);
  PoolResource<48UL,_8UL>::PoolResource(in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70)
  ;
  PoolResourceTester::CheckAllDataAccountedFor<48ul,8ul>(in_stack_fffffffffffffce0);
  PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>::PoolAllocator
            ((PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL> *)in_stack_fffffffffffffc48,
             (ResourceType *)0x903ba8);
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
  ::unordered_map(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                  (hasher *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                  (key_equal *)in_stack_fffffffffffffc50,(allocator_type *)in_stack_fffffffffffffc48
                 );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (size_t)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    local_158 = memusage::DynamicUsage<long,long,std::hash<long>>
                          ((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_chunk_size_bytes);
    local_160 = memusage::DynamicUsage<long,long,std::hash<long>,std::equal_to<long>,48ul,8ul>
                          ((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
                            *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator!=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc50,(basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 = (PoolResource<48UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_130,local_180,local_1a0,0xaf,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (resource_00 = (PoolResource<48UL,_8UL> *)0x0; resource_00 < (PoolResource<48UL,_8UL> *)0x2710
      ; resource_00 = (PoolResource<48UL,_8UL> *)((long)&resource_00->m_chunk_size_bytes + 1)) {
    local_1a8 = resource_00;
    std::
    unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
    ::operator[]((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                 (key_type *)in_stack_fffffffffffffc50);
    local_1b0 = resource_00;
    std::
    unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
    ::operator[]((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
                  *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                 (key_type *)in_stack_fffffffffffffc50);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (size_t)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    memusage::DynamicUsage<long,long,std::hash<long>,std::equal_to<long>,48ul,8ul>
              ((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
                *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_chunk_size_bytes);
    memusage::DynamicUsage<long,long,std::hash<long>>
              ((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator<=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
    in_stack_fffffffffffffc88 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc50,(basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 = (PoolResource<48UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,&local_238,local_258,0xb7,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc87 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc87);
  line_num = PoolResource<48UL,_8UL>::ChunkSizeBytes(in_stack_fffffffffffffc48);
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
  ::size((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
          *)in_stack_fffffffffffffc48);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               line_num,msg);
    local_2c0 = PoolResource<48UL,_8UL>::NumAllocatedChunks(in_stack_fffffffffffffc48);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_chunk_size_bytes);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator>=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               SUB81(line_num >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc50,(basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc48 = (PoolResource<48UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffd68,local_2e0,local_300,0xbc,CHECK,
               CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc5f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc5f);
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
  ::~unordered_map((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>_>
                    *)in_stack_fffffffffffffc48);
  PoolResourceTester::CheckAllDataAccountedFor<48ul,8ul>(resource_00);
  PoolResource<48UL,_8UL>::~PoolResource
            ((PoolResource<48UL,_8UL> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~unordered_map((unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    *)in_stack_fffffffffffffc48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(memusage_test)
{
    auto std_map = std::unordered_map<int64_t, int64_t>{};

    using Map = std::unordered_map<int64_t,
                                   int64_t,
                                   std::hash<int64_t>,
                                   std::equal_to<int64_t>,
                                   PoolAllocator<std::pair<const int64_t, int64_t>,
                                                 sizeof(std::pair<const int64_t, int64_t>) + sizeof(void*) * 4>>;
    auto resource = Map::allocator_type::ResourceType(1024);

    PoolResourceTester::CheckAllDataAccountedFor(resource);

    {
        auto resource_map = Map{0, std::hash<int64_t>{}, std::equal_to<int64_t>{}, &resource};

        // can't have the same resource usage
        BOOST_TEST(memusage::DynamicUsage(std_map) != memusage::DynamicUsage(resource_map));

        for (size_t i = 0; i < 10000; ++i) {
            std_map[i];
            resource_map[i];
        }

        // Eventually the resource_map should have a much lower memory usage because it has less malloc overhead
        BOOST_TEST(memusage::DynamicUsage(resource_map) <= memusage::DynamicUsage(std_map) * 90 / 100);

        // Make sure the pool is actually used by the nodes
        auto max_nodes_per_chunk = resource.ChunkSizeBytes() / sizeof(Map::value_type);
        auto min_num_allocated_chunks = resource_map.size() / max_nodes_per_chunk + 1;
        BOOST_TEST(resource.NumAllocatedChunks() >= min_num_allocated_chunks);
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}